

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O0

void __thiscall CVoting::ClearOptions(CVoting *this)

{
  CHeap *in_RDI;
  
  CHeap::Reset(in_RDI);
  *(undefined4 *)&in_RDI[0x11].m_pCurrent = 0;
  in_RDI[0x12].m_pCurrent = (CChunk *)0x0;
  in_RDI[0x13].m_pCurrent = (CChunk *)0x0;
  in_RDI[0x14].m_pCurrent = (CChunk *)0x0;
  in_RDI[0x15].m_pCurrent = (CChunk *)0x0;
  return;
}

Assistant:

void CVoting::ClearOptions()
{
	m_Heap.Reset();

	m_NumVoteOptions = 0;
	m_pFirst = 0;
	m_pLast = 0;

	m_pRecycleFirst = 0;
	m_pRecycleLast = 0;
}